

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeGeq
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *currentFrontier,LocalDomChg *domchg,HighsInt *inds,double *vals,HighsInt len,double rhs,
          double maxAct)

{
  double val;
  double globalbound;
  double bound;
  bool bVar1;
  HighsVarType HVar2;
  pointer pHVar3;
  reference pvVar4;
  pointer pLVar5;
  int64_t iVar6;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double in_XMM1_Qa;
  double *in_stack_00000018;
  double in_stack_00000020;
  ConflictSet *in_stack_00000028;
  HighsCDouble in_stack_00000030;
  double Mupper;
  double b0;
  const_iterator it_1;
  double lb;
  const_iterator it;
  double ub;
  ResolveCandidate cand;
  HighsInt col;
  HighsInt i;
  HighsCDouble M;
  HighsNodeQueue *nodequeue;
  double domchgVal;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_fffffffffffffe58;
  HighsCDouble *pHVar7;
  HighsMipSolver *in_stack_fffffffffffffe60;
  __normal_iterator<HighsDomain::ConflictSet::ResolveCandidate_*,_std::vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>_>
  in_stack_fffffffffffffe68;
  __normal_iterator<HighsDomain::ConflictSet::ResolveCandidate_*,_std::vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>_>
  in_stack_fffffffffffffe70;
  value_type in_stack_fffffffffffffe78;
  HighsInt col_00;
  HighsDomain *in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  *in_stack_fffffffffffffe90;
  HighsDomain *pHVar8;
  _Self local_f0;
  int local_e8;
  undefined1 auStack_e0 [16];
  _Self local_d0;
  ResolveCandidate *local_c8;
  _Self local_c0;
  int local_b8;
  undefined1 auStack_b0 [16];
  _Self local_a0;
  double local_98;
  double local_90;
  HighsDomain *local_88;
  double local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  HighsCDouble local_68;
  HighsNodeQueue *local_58;
  HighsCDouble *local_50;
  double local_48;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  bool local_1;
  
  if ((in_XMM1_Qa != INFINITY) || (NAN(in_XMM1_Qa))) {
    local_50 = (HighsCDouble *)0x0;
    local_48 = in_XMM1_Qa;
    local_34 = in_R9D;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ::reserve(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ::clear((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             *)0x5cc3ab);
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5cc3c9);
    local_58 = &pHVar3->nodequeue;
    HighsCDouble::HighsCDouble(&local_68,local_48);
    for (local_6c = 0; local_6c < local_34; local_6c = local_6c + 1) {
      local_70 = *(int *)(local_28 + (long)local_6c * 4);
      if (local_70 == *(int *)(local_20 + 0x10)) {
        local_50 = *(HighsCDouble **)(local_30 + (long)local_6c * 8);
      }
      else {
        local_74 = local_6c;
        col_00 = (HighsInt)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        if (*(double *)(local_30 + (long)local_6c * 8) <= 0.0) {
          local_c8 = (ResolveCandidate *)
                     getColLowerPos(in_stack_fffffffffffffe80,col_00,
                                    SUB84(in_stack_fffffffffffffe78,0),
                                    in_stack_fffffffffffffe70._M_current);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              (*(long *)(in_RDI + 8) + 0x308),(long)local_70);
          if ((*pvVar4 < (double)local_c8) && (local_78 != -1)) {
            local_e8 = local_78;
            memset(auStack_e0,0,0x10);
            local_d0._M_node =
                 (_Base_ptr)
                 std::
                 set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 ::find(in_stack_fffffffffffffe58,(key_type *)0x5cc816);
            local_f0._M_node =
                 (_Base_ptr)
                 std::
                 set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 ::end(in_stack_fffffffffffffe58);
            bVar1 = std::operator!=(&local_d0,&local_f0);
            if (bVar1) {
              pLVar5 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::
                       operator->((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)
                                  0x5cc85e);
              pHVar8 = (HighsDomain *)(pLVar5->domchg).boundval;
              local_88 = pHVar8;
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (*(long *)(in_RDI + 8) + 0x308),(long)local_70);
              if (((double)pHVar8 != *pvVar4) || (NAN((double)pHVar8) || NAN(*pvVar4))) {
                in_stack_fffffffffffffe80 = local_88;
                std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           (*(long *)(in_RDI + 8) + 0x308),(long)local_70);
                HighsCDouble::operator+=
                          ((HighsCDouble *)in_stack_fffffffffffffe70._M_current,
                           (double)in_stack_fffffffffffffe68._M_current);
              }
              if ((double)local_c8 <= (double)local_88) goto LAB_005cca3c;
            }
            else {
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (*(long *)(in_RDI + 8) + 0x308),(long)local_70);
              local_88 = (HighsDomain *)*pvVar4;
            }
            local_90 = *(double *)(local_30 + (long)local_6c * 8) *
                       ((double)local_c8 - (double)local_88);
            in_stack_fffffffffffffe68._M_current =
                 *(ResolveCandidate **)(local_30 + (long)local_6c * 8);
            in_stack_fffffffffffffe70._M_current = local_c8;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                (*(long *)(in_RDI + 8) + 0x308),(long)local_70);
            in_stack_fffffffffffffe78 = *pvVar4;
            iVar6 = HighsNodeQueue::numNodesUp
                              ((HighsNodeQueue *)in_stack_fffffffffffffe60,
                               (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
            local_80 = computePrio((double)in_stack_fffffffffffffe68._M_current,
                                   (double)in_stack_fffffffffffffe70._M_current,
                                   in_stack_fffffffffffffe78,iVar6);
            goto LAB_005cca20;
          }
        }
        else {
          local_98 = getColUpperPos(in_stack_fffffffffffffe80,col_00,
                                    SUB84(in_stack_fffffffffffffe78,0),
                                    (HighsInt *)in_stack_fffffffffffffe70._M_current);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              (*(long *)(in_RDI + 8) + 800),(long)local_70);
          if ((local_98 < *pvVar4) && (local_78 != -1)) {
            local_b8 = local_78;
            memset(auStack_b0,0,0x10);
            local_a0._M_node =
                 (_Base_ptr)
                 std::
                 set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 ::find(in_stack_fffffffffffffe58,(key_type *)0x5cc54a);
            local_c0._M_node =
                 (_Base_ptr)
                 std::
                 set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 ::end(in_stack_fffffffffffffe58);
            bVar1 = std::operator!=(&local_a0,&local_c0);
            if (bVar1) {
              pLVar5 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::
                       operator->((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)
                                  0x5cc592);
              pHVar8 = (HighsDomain *)(pLVar5->domchg).boundval;
              local_88 = pHVar8;
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (*(long *)(in_RDI + 8) + 800),(long)local_70);
              if (((double)pHVar8 != *pvVar4) || (NAN((double)pHVar8) || NAN(*pvVar4))) {
                std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 8) + 800),
                           (long)local_70);
                HighsCDouble::operator+=
                          ((HighsCDouble *)in_stack_fffffffffffffe70._M_current,
                           (double)in_stack_fffffffffffffe68._M_current);
              }
              if ((double)local_88 <= local_98) goto LAB_005cca3c;
            }
            else {
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (*(long *)(in_RDI + 8) + 800),(long)local_70);
              local_88 = (HighsDomain *)*pvVar4;
            }
            bound = local_98;
            local_90 = *(double *)(local_30 + (long)local_6c * 8) * (local_98 - (double)local_88);
            val = *(double *)(local_30 + (long)local_6c * 8);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                (*(long *)(in_RDI + 8) + 800),(long)local_70);
            globalbound = *pvVar4;
            iVar6 = HighsNodeQueue::numNodesDown
                              ((HighsNodeQueue *)in_stack_fffffffffffffe60,
                               (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
            local_80 = computePrio(val,bound,globalbound,iVar6);
LAB_005cca20:
            std::
            vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
            ::push_back((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                         *)in_stack_fffffffffffffe70._M_current,in_stack_fffffffffffffe68._M_current
                       );
          }
        }
      }
LAB_005cca3c:
    }
    if (((double)local_50 != 0.0) || (NAN((double)local_50))) {
      std::
      vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ::begin((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               *)in_stack_fffffffffffffe58);
      std::
      vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ::end((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             *)in_stack_fffffffffffffe58);
      pdqsort<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      HVar2 = HighsMipSolver::variableType
                        (in_stack_fffffffffffffe60,
                         (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      if (HVar2 == kContinuous) {
        if (*(int *)(local_20 + 0x14) == 0) {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x5ccbe5);
        }
        else {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x5ccc23);
        }
      }
      else if (*(int *)(local_20 + 0x14) == 0) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x5ccb2c);
      }
      else {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x5ccb82);
      }
      if (0.0 <= (double)local_50) {
        pHVar7 = local_50;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 8) + 800),
                   (long)*(int *)(local_20 + 0x10));
        HighsCDouble::operator-=((HighsCDouble *)in_stack_fffffffffffffe60,(double)pHVar7);
      }
      else {
        pHVar7 = local_50;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 8) + 0x308),
                   (long)*(int *)(local_20 + 0x10));
        HighsCDouble::operator-=(pHVar7,(double)in_stack_fffffffffffffe58);
      }
      local_1 = resolveLinearGeq(in_stack_00000028,in_stack_00000030,in_stack_00000020,
                                 in_stack_00000018);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeGeq(
    const std::set<LocalDomChg>& currentFrontier, const LocalDomChg& domchg,
    const HighsInt* inds, const double* vals, HighsInt len, double rhs,
    double maxAct) {
  if (maxAct == kHighsInf) return false;

  // get the coefficient value of the column for which we want to explain
  // the bound change
  double domchgVal = 0;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  HighsCDouble M = maxAct;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    if (col == domchg.domchg.column) {
      domchgVal = vals[i];
      continue;
    }

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double ub = localdom.getColUpperPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_upper_[col] <= ub || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});
      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_upper_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_upper_[col]);
        if (cand.baseBound <= ub) continue;
      } else
        cand.baseBound = globaldom.col_upper_[col];

      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    } else {
      double lb = localdom.getColLowerPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_lower_[col] >= lb || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});

      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_lower_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_lower_[col]);
        if (cand.baseBound >= lb) continue;
      } else
        cand.baseBound = globaldom.col_lower_[col];

      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    }

    resolveBuffer.push_back(cand);
  }

  if (domchgVal == 0) return false;

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // to explain the bound change we start from the bound constraint,
  // multiply it by the columns coefficient in the constraint. Then the
  // bound constraint is a0 * x0 >= b0 and the constraint
  // a0 * x0 + \sum ai * xi >= b. Let the max activity of \sum ai xi be M,
  // then the constraint yields the bound a0 * x0 >= b - M. If M is
  // sufficiently small the bound constraint is implied. Therefore we
  // decrease M by updating it with the stronger local bounds until
  // M <= b - b0 holds.
  double b0 = domchg.domchg.boundval;
  if (localdom.mipsolver->variableType(domchg.domchg.column) !=
      HighsVarType::kContinuous) {
    // in case of an integral variable the bound was rounded and can be
    // relaxed by 1-feastol. We use 1 - 10 * feastol for numerical safety.
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
    else
      b0 += (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
  } else {
    // for a continuous variable we relax the bound by epsilon to
    // accommodate for tiny rounding errors
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= localdom.mipsolver->mipdata_->epsilon;
    else
      b0 += localdom.mipsolver->mipdata_->epsilon;
  }

  // now multiply the bound constraint with the coefficient value in the
  // constraint to obtain b0
  b0 *= domchgVal;

  // compute the lower bound of M that is necessary
  double Mupper = rhs - b0;

  // M is the current residual activity initially
  if (domchgVal < 0)
    M -= domchgVal * globaldom.col_lower_[domchg.domchg.column];
  else
    M -= domchgVal * globaldom.col_upper_[domchg.domchg.column];

  return resolveLinearGeq(M, Mupper, vals);
}